

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall
Assimp::IFC::anon_unknown_9::TrimmedCurve::SampleDiscrete
          (TrimmedCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  element_type *peVar2;
  IfcFloat IVar3;
  IfcFloat IVar4;
  bool local_29;
  IfcFloat b_local;
  IfcFloat a_local;
  TempMesh *out_local;
  TrimmedCurve *this_local;
  
  bVar1 = Curve::InRange((Curve *)this,a);
  local_29 = false;
  if (bVar1) {
    local_29 = Curve::InRange((Curve *)this,b);
  }
  if (local_29 != false) {
    peVar2 = std::
             __shared_ptr_access<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->base);
    IVar3 = TrimParam(this,a);
    IVar4 = TrimParam(this,b);
    (*peVar2->_vptr_Curve[7])(IVar3,SUB84(IVar4,0),peVar2,out);
    return;
  }
  __assert_fail("InRange(a) && InRange(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x188,
                "virtual void Assimp::IFC::(anonymous namespace)::TrimmedCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a,IfcFloat b) const {
        ai_assert(InRange(a) && InRange(b));
        return base->SampleDiscrete(out,TrimParam(a),TrimParam(b));
    }